

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O2

int __thiscall cmCTestScriptHandler::ProcessHandler(cmCTestScriptHandler *this)

{
  pointer pbVar1;
  uint uVar2;
  uint uVar3;
  ulong __n;
  long lVar4;
  reference rVar5;
  string local_50;
  
  lVar4 = 0;
  uVar3 = 0;
  for (__n = 0; pbVar1 = (this->ConfigurationScripts).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
      __n < (ulong)((long)(this->ConfigurationScripts).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      __n = __n + 1) {
    cmsys::SystemTools::CollapseFullPath
              (&local_50,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4));
    rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->ScriptProcessScope,__n);
    uVar2 = RunConfigurationScript(this,&local_50,(*rVar5._M_p & rVar5._M_mask) != 0);
    uVar3 = uVar3 | uVar2;
    std::__cxx11::string::~string((string *)&local_50);
    lVar4 = lVar4 + 0x20;
  }
  return -(uint)(uVar3 != 0);
}

Assistant:

int cmCTestScriptHandler::ProcessHandler()
{
  int res = 0;
  for (size_t i = 0; i < this->ConfigurationScripts.size(); ++i) {
    // for each script run it
    res |= this->RunConfigurationScript(
      cmSystemTools::CollapseFullPath(this->ConfigurationScripts[i]),
      this->ScriptProcessScope[i]);
  }
  if (res) {
    return -1;
  }
  return 0;
}